

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2413.c
# Opt level: O2

void ym2413_reset_chip(void *chip)

{
  long lVar1;
  uint r;
  
  *(undefined8 *)((long)chip + 0x690) = 0;
  *(undefined4 *)((long)chip + 0x6bc) = 1;
  ym2413_override_patches(chip,*(UINT8 **)((long)chip + 0x6c8));
  OPLLWriteReg((YM2413 *)chip,0xf,0);
  for (r = 0x3f; 0xf < r; r = r - 1) {
    OPLLWriteReg((YM2413 *)chip,r,0);
  }
  for (lVar1 = 0; lVar1 != 0x678; lVar1 = lVar1 + 0xb8) {
    *(undefined4 *)((long)chip + lVar1 + 0x58) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0x2d) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0x38) = 0xff;
    *(undefined4 *)((long)chip + lVar1 + 0xac) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0x81) = 0;
    *(undefined4 *)((long)chip + lVar1 + 0x8c) = 0xff;
  }
  return;
}

Assistant:

static void ym2413_reset_chip(void *chip)
{
	YM2413 *OPLL = (YM2413 *)chip;
	OPLLResetChip(OPLL);
}